

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

void crec_finalizer(jit_State *J,TRef trcd,TRef trfin,cTValue *fin)

{
  TRef TVar1;
  void *ptr;
  
  if ((fin->field_2).it + 0xd < 9) {
    if (trfin != 0) goto LAB_0015a97d;
    ptr = (void *)(ulong)(fin->u32).lo;
  }
  else {
    if ((fin->field_2).it != 0xffffffff) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    ptr = (void *)0x0;
  }
  trfin = lj_ir_kptr_(J,IR_KPTR,ptr);
LAB_0015a97d:
  TVar1 = lj_ir_kint(J,(fin->field_2).it);
  lj_ir_call(J,IRCALL_lj_cdata_setfin,trcd,(ulong)trfin,(ulong)TVar1);
  J->needsnap = '\x01';
  return;
}

Assistant:

static void crec_finalizer(jit_State *J, TRef trcd, TRef trfin, cTValue *fin)
{
  if (tvisgcv(fin)) {
    if (!trfin) trfin = lj_ir_kptr(J, gcval(fin));
  } else if (tvisnil(fin)) {
    trfin = lj_ir_kptr(J, NULL);
  } else {
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  }
  lj_ir_call(J, IRCALL_lj_cdata_setfin, trcd,
	     trfin, lj_ir_kint(J, (int32_t)itype(fin)));
  J->needsnap = 1;
}